

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_dplx_msg.c
# Opt level: O0

_Bool xdr_dplx_msg(XDR *xdrs,rpc_msg *dmsg)

{
  xdr_op xVar1;
  _Bool _Var2;
  rpc_msg *dmsg_local;
  XDR *xdrs_local;
  
  if (xdrs == (XDR *)0x0) {
    __assert_fail("xdrs != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/rpc_dplx_msg.c"
                  ,0x1de,"_Bool xdr_dplx_msg(XDR *, struct rpc_msg *)");
  }
  if (dmsg == (rpc_msg *)0x0) {
    __assert_fail("dmsg != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/rpc_dplx_msg.c"
                  ,0x1df,"_Bool xdr_dplx_msg(XDR *, struct rpc_msg *)");
  }
  xVar1 = xdrs->x_op;
  if (xVar1 == XDR_ENCODE) {
    if (dmsg->rm_direction == CALL) {
      _Var2 = xdr_call_encode(xdrs,dmsg);
      return _Var2;
    }
    if (dmsg->rm_direction == REPLY) {
      _Var2 = xdr_reply_encode(xdrs,dmsg);
      return _Var2;
    }
    if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
      (*__ntirpc_pkg_params.warnx_)
                ("%s:%u ERROR dmsg->rm_direction (%u)","xdr_dplx_msg",0x1eb,
                 (ulong)dmsg->rm_direction);
    }
  }
  else {
    if (xVar1 == XDR_DECODE) {
      _Var2 = xdr_dplx_decode(xdrs,dmsg);
      return _Var2;
    }
    if (xVar1 == XDR_FREE) {
      if ((__ntirpc_pkg_params.debug_flags & 0x2000000) != 0) {
        (*__ntirpc_pkg_params.warnx_)("%s:%u xdrs->x_op XDR_FREE","xdr_dplx_msg",0x1f5);
      }
      return true;
    }
    if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
      (*__ntirpc_pkg_params.warnx_)
                ("%s:%u ERROR xdrs->x_op (%u)","xdr_dplx_msg",0x1fa,(ulong)xdrs->x_op);
    }
  }
  return false;
}

Assistant:

bool
xdr_dplx_msg(XDR *xdrs, struct rpc_msg *dmsg)
{
	assert(xdrs != NULL);
	assert(dmsg != NULL);

	switch (xdrs->x_op) {
	case XDR_ENCODE:
		switch (dmsg->rm_direction) {
		case CALL:
			return (xdr_call_encode(xdrs, dmsg));
		case REPLY:
			return (xdr_reply_encode(xdrs, dmsg));
		default:
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR dmsg->rm_direction (%u)",
				__func__, __LINE__,
				dmsg->rm_direction);
			break;
		};
		break;
	case XDR_DECODE:
		return (xdr_dplx_decode(xdrs, dmsg));
	case XDR_FREE:
		__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
			"%s:%u xdrs->x_op XDR_FREE",
			__func__, __LINE__);
		return (true);
	default:
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR xdrs->x_op (%u)",
			__func__, __LINE__,
			xdrs->x_op);
		break;
	};

	return (false);
}